

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

bool __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::ResizeIfLoadIsOutOfRange
          (KeyMapBase<unsigned_int> *this,size_type new_size)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  ulong local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  size_type new_num_buckets;
  size_type hypothetical_size;
  size_type lg2_of_size_reduction_factor;
  size_type lo_cutoff;
  size_type hi_cutoff;
  size_type new_size_local;
  KeyMapBase<unsigned_int> *this_local;
  
  hi_cutoff = new_size;
  new_size_local = (size_type)this;
  lo_cutoff = CalculateHiCutoff((ulong)(this->super_UntypedMapBase).num_buckets_);
  lg2_of_size_reduction_factor = lo_cutoff >> 2;
  if (lo_cutoff < hi_cutoff) {
    uVar1 = (this->super_UntypedMapBase).num_buckets_;
    sVar3 = UntypedMapBase::max_size();
    if ((ulong)uVar1 <= sVar3 >> 1) {
      Resize(this,(this->super_UntypedMapBase).num_buckets_ << 1);
      return true;
    }
  }
  else {
    bVar2 = false;
    if (hi_cutoff <= lg2_of_size_reduction_factor) {
      bVar2 = 2 < (this->super_UntypedMapBase).num_buckets_;
    }
    if (bVar2) {
      hypothetical_size = 1;
      new_num_buckets = (hi_cutoff * 5 >> 2) + 1;
      while (new_num_buckets << ((byte)hypothetical_size + 1 & 0x3f) < lo_cutoff) {
        hypothetical_size = hypothetical_size + 1;
      }
      local_50 = 2;
      local_58 = (ulong)((this->super_UntypedMapBase).num_buckets_ >>
                        ((byte)hypothetical_size & 0x1f));
      puVar4 = std::max<unsigned_long>(&local_50,&local_58);
      local_48 = *puVar4;
      if (local_48 != (this->super_UntypedMapBase).num_buckets_) {
        Resize(this,(map_index_t)local_48);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ResizeIfLoadIsOutOfRange(size_type new_size) {
    const size_type hi_cutoff = CalculateHiCutoff(num_buckets_);
    const size_type lo_cutoff = hi_cutoff / 4;
    // We don't care how many elements are in trees.  If a lot are,
    // we may resize even though there are many empty buckets.  In
    // practice, this seems fine.
    if (ABSL_PREDICT_FALSE(new_size > hi_cutoff)) {
      if (num_buckets_ <= max_size() / 2) {
        Resize(kMinTableSize > kGlobalEmptyTableSize * 2
                   ? std::max(kMinTableSize, num_buckets_ * 2)
                   : num_buckets_ * 2);
        return true;
      }
    } else if (ABSL_PREDICT_FALSE(new_size <= lo_cutoff &&
                                  num_buckets_ > kMinTableSize)) {
      size_type lg2_of_size_reduction_factor = 1;
      // It's possible we want to shrink a lot here... size() could even be 0.
      // So, estimate how much to shrink by making sure we don't shrink so
      // much that we would need to grow the table after a few inserts.
      const size_type hypothetical_size = new_size * 5 / 4 + 1;
      while ((hypothetical_size << (1 + lg2_of_size_reduction_factor)) <
             hi_cutoff) {
        ++lg2_of_size_reduction_factor;
      }
      size_type new_num_buckets = std::max<size_type>(
          kMinTableSize, num_buckets_ >> lg2_of_size_reduction_factor);
      if (new_num_buckets != num_buckets_) {
        Resize(new_num_buckets);
        return true;
      }
    }
    return false;
  }